

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

void * OPENSSL_realloc(void *orig_ptr,size_t new_size)

{
  ulong uVar1;
  undefined8 local_40;
  size_t to_copy;
  void *ret;
  void *ptr;
  size_t old_size;
  size_t new_size_local;
  void *orig_ptr_local;
  
  if (orig_ptr == (void *)0x0) {
    orig_ptr_local = OPENSSL_malloc(new_size);
  }
  else {
    uVar1 = OPENSSL_memory_get_size(orig_ptr);
    orig_ptr_local = OPENSSL_malloc(new_size);
    if (orig_ptr_local == (void *)0x0) {
      orig_ptr_local = (void *)0x0;
    }
    else {
      local_40 = new_size;
      if (uVar1 < new_size) {
        local_40 = uVar1;
      }
      memcpy(orig_ptr_local,orig_ptr,local_40);
      OPENSSL_free(orig_ptr);
    }
  }
  return orig_ptr_local;
}

Assistant:

void *OPENSSL_realloc(void *orig_ptr, size_t new_size) {
  if (orig_ptr == NULL) {
    return OPENSSL_malloc(new_size);
  }

  size_t old_size;
  if (OPENSSL_memory_get_size != NULL) {
    old_size = OPENSSL_memory_get_size(orig_ptr);
  } else {
    void *ptr = ((uint8_t *)orig_ptr) - OPENSSL_MALLOC_PREFIX;
    __asan_unpoison_memory_region(ptr, OPENSSL_MALLOC_PREFIX);
    old_size = *(size_t *)ptr;
    __asan_poison_memory_region(ptr, OPENSSL_MALLOC_PREFIX);
  }

  void *ret = OPENSSL_malloc(new_size);
  if (ret == NULL) {
    return NULL;
  }

  size_t to_copy = new_size;
  if (old_size < to_copy) {
    to_copy = old_size;
  }

  memcpy(ret, orig_ptr, to_copy);
  OPENSSL_free(orig_ptr);

  return ret;
}